

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int resize_properties(JSContext *ctx,JSShape **psh,JSObject *p,uint32_t count)

{
  JSShape *__src;
  list_head *plVar1;
  JSRuntime *pJVar2;
  JSProperty *pJVar3;
  void *pvVar4;
  JSShape *pJVar5;
  uint uVar6;
  list_head *plVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  JSShape *__dest;
  uint uVar12;
  ulong uVar13;
  JSShape *old_sh;
  
  __src = *psh;
  uVar9 = (__src->prop_size * 3) / 2;
  if ((int)uVar9 < (int)count) {
    uVar9 = count;
  }
  uVar11 = (ulong)uVar9;
  if (p != (JSObject *)0x0) {
    pJVar3 = (JSProperty *)js_realloc(ctx,p->prop,uVar11 << 4);
    if (pJVar3 == (JSProperty *)0x0) {
      return -1;
    }
    p->prop = pJVar3;
  }
  uVar10 = __src->prop_hash_mask;
  uVar6 = uVar10 + 1;
  uVar12 = uVar6;
  do {
    uVar8 = uVar12;
    uVar12 = uVar8 * 2;
  } while (uVar8 < uVar9);
  if (uVar8 == uVar6) {
    plVar1 = (__src->header).link.prev;
    plVar7 = (__src->header).link.next;
    plVar1->next = plVar7;
    plVar7->prev = plVar1;
    (__src->header).link.prev = (list_head *)0x0;
    (__src->header).link.next = (list_head *)0x0;
    uVar13 = (ulong)uVar6;
    pvVar4 = js_realloc(ctx,&(__src->header).ref_count + ~(ulong)uVar10,
                        uVar13 * 4 + uVar11 * 8 + 0x40);
    if (pvVar4 != (void *)0x0) {
      __dest = (JSShape *)((long)pvVar4 + uVar13 * 4);
      plVar7 = (list_head *)((long)pvVar4 + uVar13 * 4 + 8);
      pJVar2 = ctx->rt;
      plVar1 = (pJVar2->gc_obj_list).prev;
      plVar1->next = plVar7;
      *(list_head **)((long)pvVar4 + uVar13 * 4 + 8) = plVar1;
      *(list_head **)((long)pvVar4 + uVar13 * 4 + 0x10) = &pJVar2->gc_obj_list;
      (pJVar2->gc_obj_list).prev = plVar7;
LAB_00135361:
      *psh = __dest;
      __dest->prop_size = uVar9;
      return 0;
    }
    plVar1 = &(__src->header).link;
    pJVar2 = ctx->rt;
    plVar7 = (pJVar2->gc_obj_list).prev;
    plVar7->next = plVar1;
    (__src->header).link.prev = plVar7;
    (__src->header).link.next = &pJVar2->gc_obj_list;
    (pJVar2->gc_obj_list).prev = plVar1;
  }
  else {
    uVar13 = (ulong)uVar8;
    pvVar4 = js_malloc(ctx,uVar13 * 4 + uVar11 * 8 + 0x40);
    if (pvVar4 != (void *)0x0) {
      __dest = (JSShape *)((long)pvVar4 + uVar13 * 4);
      plVar1 = (__src->header).link.prev;
      plVar7 = (__src->header).link.next;
      plVar1->next = plVar7;
      plVar7->prev = plVar1;
      (__src->header).link.prev = (list_head *)0x0;
      (__src->header).link.next = (list_head *)0x0;
      memcpy(__dest,__src,(long)__src->prop_count * 8 + 0x40);
      plVar7 = (list_head *)(uVar13 * 4 + 8 + (long)pvVar4);
      pJVar2 = ctx->rt;
      plVar1 = (pJVar2->gc_obj_list).prev;
      plVar1->next = plVar7;
      *(list_head **)((long)pvVar4 + uVar13 * 4 + 8) = plVar1;
      *(list_head **)((long)pvVar4 + uVar13 * 4 + 0x10) = &pJVar2->gc_obj_list;
      (pJVar2->gc_obj_list).prev = plVar7;
      *(uint *)((long)pvVar4 + uVar13 * 4 + 0x20) = uVar8 - 1;
      uVar12 = 0;
      memset(pvVar4,0,uVar13 * 4);
      uVar10 = *(uint *)((long)pvVar4 + uVar13 * 4 + 0x28);
      if (uVar10 != 0) {
        pJVar5 = __dest + 1;
        do {
          uVar6 = *(uint *)&(pJVar5->header).field_0x4;
          if (uVar6 != 0) {
            uVar11 = ~(ulong)(uVar6 & uVar8 - 1);
            (pJVar5->header).ref_count =
                 (pJVar5->header).ref_count & 0xfc000000U |
                 (&(__dest->header).ref_count)[uVar11] & 0x3ffffffU;
            (&(__dest->header).ref_count)[uVar11] = uVar12 + 1;
            uVar10 = __dest->prop_count;
          }
          uVar12 = uVar12 + 1;
          pJVar5 = (JSShape *)&(pJVar5->header).link;
        } while (uVar12 < uVar10);
      }
      (*(ctx->rt->mf).js_free)
                (&ctx->rt->malloc_state,&(__src->header).ref_count + ~(ulong)__src->prop_hash_mask);
      goto LAB_00135361;
    }
  }
  return -1;
}

Assistant:

static no_inline int resize_properties(JSContext *ctx, JSShape **psh,
                                       JSObject *p, uint32_t count)
{
    JSShape *sh;
    uint32_t new_size, new_hash_size, new_hash_mask, i;
    JSShapeProperty *pr;
    void *sh_alloc;
    intptr_t h;

    sh = *psh;
    new_size = max_int(count, sh->prop_size * 3 / 2);
    /* Reallocate prop array first to avoid crash or size inconsistency
       in case of memory allocation failure */
    if (p) {
        JSProperty *new_prop;
        new_prop = js_realloc(ctx, p->prop, sizeof(new_prop[0]) * new_size);
        if (unlikely(!new_prop))
            return -1;
        p->prop = new_prop;
    }
    new_hash_size = sh->prop_hash_mask + 1;
    while (new_hash_size < new_size)
        new_hash_size = 2 * new_hash_size;
    if (new_hash_size != (sh->prop_hash_mask + 1)) {
        JSShape *old_sh;
        /* resize the hash table and the properties */
        old_sh = sh;
        sh_alloc = js_malloc(ctx, get_shape_size(new_hash_size, new_size));
        if (!sh_alloc)
            return -1;
        sh = get_shape_from_alloc(sh_alloc, new_hash_size);
        list_del(&old_sh->header.link);
        /* copy all the fields and the properties */
        memcpy(sh, old_sh,
               sizeof(JSShape) + sizeof(sh->prop[0]) * old_sh->prop_count);
        list_add_tail(&sh->header.link, &ctx->rt->gc_obj_list);
        new_hash_mask = new_hash_size - 1;
        sh->prop_hash_mask = new_hash_mask;
        memset(prop_hash_end(sh) - new_hash_size, 0,
               sizeof(prop_hash_end(sh)[0]) * new_hash_size);
        for(i = 0, pr = sh->prop; i < sh->prop_count; i++, pr++) {
            if (pr->atom != JS_ATOM_NULL) {
                h = ((uintptr_t)pr->atom & new_hash_mask);
                pr->hash_next = prop_hash_end(sh)[-h - 1];
                prop_hash_end(sh)[-h - 1] = i + 1;
            }
        }
        js_free(ctx, get_alloc_from_shape(old_sh));
    } else {
        /* only resize the properties */
        list_del(&sh->header.link);
        sh_alloc = js_realloc(ctx, get_alloc_from_shape(sh),
                              get_shape_size(new_hash_size, new_size));
        if (unlikely(!sh_alloc)) {
            /* insert again in the GC list */
            list_add_tail(&sh->header.link, &ctx->rt->gc_obj_list);
            return -1;
        }
        sh = get_shape_from_alloc(sh_alloc, new_hash_size);
        list_add_tail(&sh->header.link, &ctx->rt->gc_obj_list);
    }
    *psh = sh;
    sh->prop_size = new_size;
    return 0;
}